

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

bool TranslateModuleImports
               (ExpressionTranslateContext *ctx,SmallArray<const_char_*,_32U> *dependencies)

{
  ModuleData *pMVar1;
  char **ppcVar2;
  char *pcVar3;
  OutputContext *pOVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  ByteCode *code;
  char *pcVar10;
  ExprModule *expression;
  ExpressionContext *pEVar11;
  size_t sVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint fileSize;
  ExpressionTranslateContext nested;
  char path [1024];
  char nextModuleRootBuf [1024];
  char *local_b230;
  ExpressionTranslateContext local_b218;
  char local_b088 [1024];
  char local_ac88 [1032];
  CompilerContext local_a880;
  
  pEVar11 = ctx->ctx;
  if (1 < (pEVar11->imports).count) {
    uVar13 = 1;
    do {
      pMVar1 = (pEVar11->imports).data[uVar13];
      pcVar7 = GetModuleOutputPath(ctx->allocator,pMVar1->name);
      uVar14 = dependencies->count;
      if ((ulong)uVar14 != 0) {
        ppcVar2 = dependencies->data;
        uVar15 = 0;
        do {
          iVar6 = strcmp(ppcVar2[uVar15],pcVar7);
          if (iVar6 == 0) goto LAB_001452e2;
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      if (uVar14 == dependencies->max) {
        SmallArray<const_char_*,_32U>::grow(dependencies,uVar14);
      }
      if (dependencies->data == (char **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<const char *, 32>::push_back(const T &) [T = const char *, N = 32]"
                     );
      }
      uVar14 = dependencies->count;
      dependencies->count = uVar14 + 1;
      dependencies->data[uVar14] = pcVar7;
      if (*(pMVar1->name).end != '\0') {
        __assert_fail("*data->name.end == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x7ee,
                      "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                     );
      }
      pcVar8 = strstr((pMVar1->name).begin,".nc");
      if (pcVar8 == (char *)0x0) {
        __assert_fail("strstr(data->name.begin, \".nc\") != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x7ef,
                      "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                     );
      }
      uVar14 = 0;
      do {
        pcVar8 = BinaryCache::EnumImportPath(uVar14);
        if (pcVar8 == (char *)0x0) {
          if (*(pMVar1->name).end != '\0') {
            __assert_fail("*data->name.end == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                          ,0x805,
                          "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                         );
          }
          code = (ByteCode *)BinaryCache::FindBytecode((pMVar1->name).begin,false);
          if (code == (ByteCode *)0x0) {
            pcVar7 = (pMVar1->name).begin;
            NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,
                               "ERROR: module \'%.*s\' input file \'%s\' could not be opened",
                               (ulong)(uint)(*(int *)&(pMVar1->name).end - (int)pcVar7),pcVar7,
                               local_b088);
            return false;
          }
          pcVar9 = FindSource(code);
          break;
        }
        uVar14 = uVar14 + 1;
        NULLC::SafeSprintf(local_b088,0x400,"%s%.*s",pcVar8,
                           (ulong)(uint)(*(int *)&(pMVar1->name).end - (int)(pMVar1->name).begin));
        pcVar9 = (char *)(*(code *)NULLC::fileLoad)(local_b088);
      } while (pcVar9 == (char *)0x0);
      pcVar3 = (pMVar1->name).begin;
      pcVar10 = (pMVar1->name).end;
      if (pcVar3 == pcVar10) {
LAB_0014507e:
        local_b230 = (char *)0x0;
      }
      else {
        do {
          pcVar10 = pcVar10 + -1;
          if (pcVar10 < pcVar3) goto LAB_0014507e;
        } while (*pcVar10 != '/');
        local_b230 = local_ac88;
        NULLC::SafeSprintf(local_b230,0x400,"%.*s");
      }
      CompilerContext::CompilerContext
                (&local_a880,ctx->allocator,0,(ArrayView<InplaceStr>)ZEXT816(0));
      local_a880.errorBuf = ctx->errorBuf;
      local_a880.errorBufSize = ctx->errorBufSize;
      pOVar4 = ctx->output;
      local_a880.outputCtx.openStream = pOVar4->openStream;
      local_a880.outputCtx.writeStream = pOVar4->writeStream;
      local_a880.outputCtx.closeStream = pOVar4->closeStream;
      local_a880.outputCtx.outputBuf = pOVar4->outputBuf;
      local_a880.outputCtx.outputBufSize = pOVar4->outputBufSize;
      local_a880.outputCtx.tempBuf = pOVar4->tempBuf;
      local_a880.outputCtx.tempBufSize = pOVar4->tempBufSize;
      local_a880.moduleRoot = local_b230;
      local_a880.code = pcVar9;
      expression = AnalyzeModuleFromSource(&local_a880);
      local_a880.code = (char *)0x0;
      if (expression == (ExprModule *)0x0) {
        if (ctx->errorPos != (char *)0x0) {
          ctx->errorPos = local_a880.errorPos;
        }
        pcVar7 = ctx->errorBuf;
        if ((pcVar7 != (char *)0x0) && (uVar14 = ctx->errorBufSize, uVar14 != 0)) {
          sVar12 = strlen(pcVar7);
          NULLC::SafeSprintf(pcVar7 + (sVar12 & 0xffffffff),(ulong)(uVar14 - (int)sVar12),
                             " [in module \'%.*s\']",
                             (ulong)(uint)(*(int *)&(pMVar1->name).end - (int)(pMVar1->name).begin))
          ;
        }
        if (pcVar8 != (char *)0x0) {
          (*(code *)NULLC::fileFree)(pcVar9);
        }
        goto LAB_0014547d;
      }
      local_b218.ctx = &local_a880.exprCtx;
      local_b218.output = &local_a880.outputCtx;
      local_b218.loopBreakIdStack.allocator = local_a880.allocator;
      local_b218.loopBreakIdStack.data = local_b218.loopBreakIdStack.little;
      local_b218.loopBreakIdStack.count = 0;
      local_b218.loopBreakIdStack.max = 0x20;
      local_b218.loopContinueIdStack.allocator = local_a880.allocator;
      local_b218.loopContinueIdStack.data = local_b218.loopContinueIdStack.little;
      local_b218.loopContinueIdStack.count = 0;
      local_b218.loopContinueIdStack.max = 0x20;
      local_b218.allocator = local_a880.allocator;
      local_b218.mainName = "main";
      local_b218.indent = "\t";
      local_b218.errorBufSize = 0;
      local_b218.depth = 0;
      local_b218.errorPos = (char *)0x0;
      local_b218.errorBuf = (char *)0x0;
      local_b218.nextLoopBreakId = 1;
      local_b218.nextLoopContinueId = 1;
      local_b218.nextReturnValueId = 1;
      local_b218.skipFunctionDefinitions = false;
      local_b218.currentFunction = (FunctionData *)0x0;
      if (local_a880.outputCtx.stream != (void *)0x0) {
        __assert_fail("!compilerCtx.outputCtx.stream",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x84a,
                      "bool TranslateModuleImports(ExpressionTranslateContext &, SmallArray<const char *, 32> &)"
                     );
      }
      local_a880.outputCtx.stream = (*local_a880.outputCtx.openStream)(pcVar7);
      if (local_a880.outputCtx.stream == (void *)0x0) {
        pcVar7 = (pMVar1->name).begin;
        NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,
                           "ERROR: module \'%.*s\' output file \'%s\' could not be opened",
                           (ulong)(uint)(*(int *)&(pMVar1->name).end - (int)pcVar7),pcVar7,
                           local_b088);
        if (pcVar8 != (char *)0x0) {
          (*(code *)NULLC::fileFree)(pcVar9);
        }
LAB_00145466:
        SmallArray<unsigned_int,_32U>::~SmallArray(&local_b218.loopContinueIdStack);
        SmallArray<unsigned_int,_32U>::~SmallArray(&local_b218.loopBreakIdStack);
LAB_0014547d:
        CompilerContext::~CompilerContext(&local_a880);
        return false;
      }
      local_b218.mainName = GetModuleMainName(ctx->allocator,pMVar1->name);
      local_b218.indent = ctx->indent;
      local_b218.errorBuf = ctx->errorBuf;
      local_b218.errorBufSize = ctx->errorBufSize;
      bVar5 = TranslateModule(&local_b218,expression,dependencies);
      if (!bVar5) {
        pcVar7 = ctx->errorBuf;
        sVar12 = strlen(pcVar7);
        NULLC::SafeSprintf(pcVar7 + (sVar12 & 0xffffffff),(ulong)(ctx->errorBufSize - (int)sVar12),
                           " [in module \'%.*s\']",
                           (ulong)(uint)(*(int *)&(pMVar1->name).end - (int)(pMVar1->name).begin));
        (*local_a880.outputCtx.closeStream)(local_a880.outputCtx.stream);
        local_a880.outputCtx.stream = (void *)0x0;
        if (pcVar8 != (char *)0x0) {
          (*(code *)NULLC::fileFree)(pcVar9);
        }
        goto LAB_00145466;
      }
      (*local_a880.outputCtx.closeStream)(local_a880.outputCtx.stream);
      local_a880.outputCtx.stream = (void *)0x0;
      if (pcVar8 != (char *)0x0) {
        (*(code *)NULLC::fileFree)(pcVar9);
      }
      SmallArray<unsigned_int,_32U>::~SmallArray(&local_b218.loopContinueIdStack);
      SmallArray<unsigned_int,_32U>::~SmallArray(&local_b218.loopBreakIdStack);
      CompilerContext::~CompilerContext(&local_a880);
LAB_001452e2:
      uVar13 = uVar13 + 1;
      pEVar11 = ctx->ctx;
      uVar14 = (pEVar11->imports).count;
    } while (uVar13 < uVar14);
    if (1 < uVar14) {
      uVar13 = 1;
      do {
        pMVar1 = (pEVar11->imports).data[uVar13];
        PrintIndentedLine(ctx,"// Requires \'%.*s\'",
                          (ulong)(uint)(*(int *)&(pMVar1->name).end - (int)(pMVar1->name).begin));
        uVar13 = uVar13 + 1;
        pEVar11 = ctx->ctx;
      } while (uVar13 < (pEVar11->imports).count);
    }
  }
  return true;
}

Assistant:

bool TranslateModuleImports(ExpressionTranslateContext &ctx, SmallArray<const char*, 32> &dependencies)
{
	// Translate all imports (expept base)
	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData *data = ctx.ctx.imports[i];

		const char *targetName = GetModuleOutputPath(ctx.allocator, data->name);

		bool found = false;

		for(unsigned k = 0; k < dependencies.size(); k++)
		{
			if(strcmp(dependencies[k], targetName) == 0)
			{
				found = true;
				break;
			}
		}

		if(found)
			continue;

		dependencies.push_back(targetName);

		assert(*data->name.end == 0);
		assert(strstr(data->name.begin, ".nc") != NULL);

		unsigned fileSize = 0;
		char *fileContent = NULL;
		bool bytecodeFile = false;

		const unsigned pathLength = 1024;
		char path[pathLength];

		unsigned modulePathPos = 0;
		while(const char *modulePath = BinaryCache::EnumImportPath(modulePathPos++))
		{
			NULLC::SafeSprintf(path, pathLength, "%s%.*s", modulePath, FMT_ISTR(data->name));

			fileContent = (char*)NULLC::fileLoad(path, &fileSize);

			if(fileContent)
				break;
		}

		if(!fileContent)
		{
			assert(*data->name.end == 0);

			const char *bytecode = BinaryCache::FindBytecode(data->name.begin, false);

			if(!bytecode)
			{
				NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: module '%.*s' input file '%s' could not be opened", FMT_ISTR(data->name), path);
				return false;
			}

			fileContent = FindSource((ByteCode*)bytecode);
			bytecodeFile = true;
		}

		const unsigned nextModuleRootLength = 1024;
		char nextModuleRootBuf[nextModuleRootLength];

		const char *nextModuleRoot = NULL;

		if(const char *pos = data->name.rfind('/'))
		{
			NULLC::SafeSprintf(nextModuleRootBuf, nextModuleRootLength, "%.*s", unsigned(pos - data->name.begin), data->name.begin);

			nextModuleRoot = nextModuleRootBuf;
		}

		CompilerContext compilerCtx(ctx.allocator, 0, ArrayView<InplaceStr>());

		compilerCtx.errorBuf = ctx.errorBuf;
		compilerCtx.errorBufSize = ctx.errorBufSize;

		compilerCtx.outputCtx.openStream = ctx.output.openStream;
		compilerCtx.outputCtx.writeStream = ctx.output.writeStream;
		compilerCtx.outputCtx.closeStream = ctx.output.closeStream;

		compilerCtx.outputCtx.outputBuf = ctx.output.outputBuf;
		compilerCtx.outputCtx.outputBufSize = ctx.output.outputBufSize;

		compilerCtx.outputCtx.tempBuf = ctx.output.tempBuf;
		compilerCtx.outputCtx.tempBufSize = ctx.output.tempBufSize;

		compilerCtx.code = fileContent;
		compilerCtx.moduleRoot = nextModuleRoot;

		ExprModule* nestedModule = AnalyzeModuleFromSource(compilerCtx);

		if(!nestedModule)
		{
			compilerCtx.code = NULL;

			if(ctx.errorPos)
				ctx.errorPos = compilerCtx.errorPos;

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				unsigned currLen = (unsigned)strlen(ctx.errorBuf);
				NULLC::SafeSprintf(ctx.errorBuf + currLen, ctx.errorBufSize - currLen, " [in module '%.*s']", FMT_ISTR(data->name));
			}

			if(!bytecodeFile)
				NULLC::fileFree(fileContent);

			return false;
		}

		compilerCtx.code = NULL;

		ExpressionTranslateContext nested(compilerCtx.exprCtx, compilerCtx.outputCtx, compilerCtx.allocator);

		assert(!compilerCtx.outputCtx.stream);

		compilerCtx.outputCtx.stream = compilerCtx.outputCtx.openStream(targetName);

		if(!compilerCtx.outputCtx.stream)
		{
			NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: module '%.*s' output file '%s' could not be opened", FMT_ISTR(data->name), path);

			if(!bytecodeFile)
				NULLC::fileFree(fileContent);

			return false;
		}

		nested.mainName = GetModuleMainName(ctx.allocator, data->name);

		nested.indent = ctx.indent;

		nested.errorBuf = ctx.errorBuf;
		nested.errorBufSize = ctx.errorBufSize;

		if(!TranslateModule(nested, nestedModule, dependencies))
		{
			unsigned currLen = (unsigned)strlen(ctx.errorBuf);
			NULLC::SafeSprintf(ctx.errorBuf + currLen, ctx.errorBufSize - currLen, " [in module '%.*s']", FMT_ISTR(data->name));

			compilerCtx.outputCtx.closeStream(compilerCtx.outputCtx.stream);
			compilerCtx.outputCtx.stream = NULL;

			if(!bytecodeFile)
				NULLC::fileFree(fileContent);

			return false;
		}

		compilerCtx.outputCtx.closeStream(compilerCtx.outputCtx.stream);
		compilerCtx.outputCtx.stream = NULL;

		if(!bytecodeFile)
			NULLC::fileFree(fileContent);
	}

	// Translate all imports (expept base)
	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData* data = ctx.ctx.imports[i];

		PrintIndentedLine(ctx, "// Requires '%.*s'", FMT_ISTR(data->name));
	}

	return true;
}